

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

void icu_63::Hangul::getRawDecomposition(UChar32 c,UChar *buffer)

{
  short sVar1;
  int iVar2;
  UChar32 c2;
  UChar32 orig;
  UChar *buffer_local;
  UChar32 c_local;
  
  iVar2 = (c + -0xac00) % 0x1c;
  if (iVar2 == 0) {
    iVar2 = (c + -0xac00) / 0x1c;
    *buffer = (short)(iVar2 / 0x15) + L'ᄀ';
    buffer[1] = (short)(iVar2 % 0x15) + L'ᅡ';
  }
  else {
    sVar1 = (short)iVar2;
    *buffer = (short)c - sVar1;
    buffer[1] = sVar1 + L'ᆧ';
  }
  return;
}

Assistant:

static inline void getRawDecomposition(UChar32 c, UChar buffer[2]) {
        UChar32 orig=c;
        c-=HANGUL_BASE;
        UChar32 c2=c%JAMO_T_COUNT;
        if(c2==0) {
            c/=JAMO_T_COUNT;
            buffer[0]=(UChar)(JAMO_L_BASE+c/JAMO_V_COUNT);
            buffer[1]=(UChar)(JAMO_V_BASE+c%JAMO_V_COUNT);
        } else {
            buffer[0]=(UChar)(orig-c2);  // LV syllable
            buffer[1]=(UChar)(JAMO_T_BASE+c2);
        }
    }